

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_ObjSugraphSize(Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsCi(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (iVar1 < 2) {
      pAVar3 = Abc_ObjFanin0(pObj);
      iVar1 = Abc_ObjSugraphSize(pAVar3);
      pAVar3 = Abc_ObjFanin1(pObj);
      iVar2 = Abc_ObjSugraphSize(pAVar3);
      pObj_local._4_4_ = iVar1 + 1 + iVar2;
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_ObjSugraphSize( Abc_Obj_t * pObj )
{
    if ( Abc_ObjIsCi(pObj) )
        return 0;
    if ( Abc_ObjFanoutNum(pObj) > 1 )
        return 0;
    return 1 + Abc_ObjSugraphSize(Abc_ObjFanin0(pObj)) + 
        Abc_ObjSugraphSize(Abc_ObjFanin1(pObj));
}